

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type * __thiscall
FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>
::dx(value_type *__return_storage_ptr__,
    FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>
    *this,int i)

{
  value_type local_70;
  value_type local_50;
  FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> local_30;
  
  FadBinaryAdd<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>
  ::dx(&local_50,&this->left_->fadexpr_,i);
  FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>::dx(&local_70,&this->right_->fadexpr_,i);
  local_30.fadexpr_.left_ = &local_50;
  local_30.fadexpr_.right_ = &local_70;
  Fad<double>::Fad<FadBinaryAdd<Fad<double>,Fad<double>>>(__return_storage_ptr__,&local_30);
  Fad<double>::~Fad(&local_70);
  Fad<double>::~Fad(&local_50);
  return __return_storage_ptr__;
}

Assistant:

const value_type dx(int i) const {return left_.dx(i) + right_.dx(i);}